

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void ARGBShadeRow_SSE2(uint8_t *src_argb,uint8_t *dst_argb,int width,uint32_t value)

{
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  ushort uVar4;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  undefined1 auVar5 [16];
  undefined1 auVar12 [16];
  ushort uVar19;
  ushort uVar20;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ushort uVar29;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 auVar30 [16];
  uint32_t value_local;
  int width_local;
  uint8_t *dst_argb_local;
  uint8_t *src_argb_local;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar33 = (undefined1)(value >> 0x18);
  uVar32 = (undefined1)(value >> 0x10);
  uVar31 = (undefined1)(value >> 8);
  uVar2 = CONCAT62(CONCAT51(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar33,uVar33),uVar32),
                                                    CONCAT14(uVar32,value)) >> 0x20),uVar31),uVar31)
                   ,CONCAT11((char)value,(char)value));
  auVar30._8_8_ = uVar2;
  auVar30._0_8_ = uVar2;
  do {
    auVar12 = *(undefined1 (*) [16])src_argb;
    src_argb = (uint8_t *)((long)src_argb + 0x10);
    auVar11._0_14_ = auVar12._0_14_;
    auVar11[0xe] = auVar12[7];
    auVar11[0xf] = auVar12[7];
    auVar10._14_2_ = auVar11._14_2_;
    auVar10._0_13_ = auVar12._0_13_;
    auVar10[0xd] = auVar12[6];
    auVar9._13_3_ = auVar10._13_3_;
    auVar9._0_12_ = auVar12._0_12_;
    auVar9[0xc] = auVar12[6];
    auVar8._12_4_ = auVar9._12_4_;
    auVar8._0_11_ = auVar12._0_11_;
    auVar8[0xb] = auVar12[5];
    auVar7._11_5_ = auVar8._11_5_;
    auVar7._0_10_ = auVar12._0_10_;
    auVar7[10] = auVar12[5];
    auVar6._10_6_ = auVar7._10_6_;
    auVar6._0_9_ = auVar12._0_9_;
    auVar6[9] = auVar12[4];
    auVar5._9_7_ = auVar6._9_7_;
    auVar5._0_8_ = auVar12._0_8_;
    auVar5[8] = auVar12[4];
    auVar22._8_8_ = auVar5._8_8_;
    auVar22[7] = auVar12[3];
    auVar22[6] = auVar12[3];
    auVar22[5] = auVar12[2];
    auVar22[4] = auVar12[2];
    auVar22[3] = auVar12[1];
    auVar22[2] = auVar12[1];
    auVar22[0] = auVar12[0];
    auVar22[1] = auVar22[0];
    auVar21[1] = auVar12[8];
    auVar21[0] = auVar12[8];
    auVar21[2] = auVar12[9];
    auVar21[3] = auVar12[9];
    auVar21[4] = auVar12[10];
    auVar21[5] = auVar12[10];
    auVar21[6] = auVar12[0xb];
    auVar21[7] = auVar12[0xb];
    auVar21[8] = auVar12[0xc];
    auVar21[9] = auVar12[0xc];
    auVar21[10] = auVar12[0xd];
    auVar21[0xb] = auVar12[0xd];
    auVar21[0xc] = auVar12[0xe];
    auVar21[0xd] = auVar12[0xe];
    auVar21[0xf] = auVar12[0xf];
    auVar21[0xe] = auVar21[0xf];
    auVar12 = pmulhuw(auVar22,auVar30);
    auVar22 = pmulhuw(auVar21,auVar30);
    uVar4 = auVar12._0_2_ >> 8;
    uVar13 = auVar12._2_2_ >> 8;
    uVar14 = auVar12._4_2_ >> 8;
    uVar15 = auVar12._6_2_ >> 8;
    uVar16 = auVar12._8_2_ >> 8;
    uVar17 = auVar12._10_2_ >> 8;
    uVar18 = auVar12._12_2_ >> 8;
    uVar19 = auVar12._14_2_ >> 8;
    uVar20 = auVar22._0_2_ >> 8;
    uVar23 = auVar22._2_2_ >> 8;
    uVar24 = auVar22._4_2_ >> 8;
    uVar25 = auVar22._6_2_ >> 8;
    uVar26 = auVar22._8_2_ >> 8;
    uVar27 = auVar22._10_2_ >> 8;
    uVar28 = auVar22._12_2_ >> 8;
    uVar29 = auVar22._14_2_ >> 8;
    *dst_argb = (uVar4 != 0) * (uVar4 < 0x100) * auVar12[1] - (0xff < uVar4);
    dst_argb[1] = (uVar13 != 0) * (uVar13 < 0x100) * auVar12[3] - (0xff < uVar13);
    dst_argb[2] = (uVar14 != 0) * (uVar14 < 0x100) * auVar12[5] - (0xff < uVar14);
    dst_argb[3] = (uVar15 != 0) * (uVar15 < 0x100) * auVar12[7] - (0xff < uVar15);
    dst_argb[4] = (uVar16 != 0) * (uVar16 < 0x100) * auVar12[9] - (0xff < uVar16);
    dst_argb[5] = (uVar17 != 0) * (uVar17 < 0x100) * auVar12[0xb] - (0xff < uVar17);
    dst_argb[6] = (uVar18 != 0) * (uVar18 < 0x100) * auVar12[0xd] - (0xff < uVar18);
    dst_argb[7] = (uVar19 != 0) * (uVar19 < 0x100) * auVar12[0xf] - (0xff < uVar19);
    dst_argb[8] = (uVar20 != 0) * (uVar20 < 0x100) * auVar22[1] - (0xff < uVar20);
    dst_argb[9] = (uVar23 != 0) * (uVar23 < 0x100) * auVar22[3] - (0xff < uVar23);
    dst_argb[10] = (uVar24 != 0) * (uVar24 < 0x100) * auVar22[5] - (0xff < uVar24);
    dst_argb[0xb] = (uVar25 != 0) * (uVar25 < 0x100) * auVar22[7] - (0xff < uVar25);
    dst_argb[0xc] = (uVar26 != 0) * (uVar26 < 0x100) * auVar22[9] - (0xff < uVar26);
    dst_argb[0xd] = (uVar27 != 0) * (uVar27 < 0x100) * auVar22[0xb] - (0xff < uVar27);
    dst_argb[0xe] = (uVar28 != 0) * (uVar28 < 0x100) * auVar22[0xd] - (0xff < uVar28);
    dst_argb[0xf] = (uVar29 != 0) * (uVar29 < 0x100) * auVar22[0xf] - (0xff < uVar29);
    dst_argb = dst_argb + 0x10;
    iVar3 = width + -4;
    bVar1 = 3 < width;
    width = iVar3;
  } while (iVar3 != 0 && bVar1);
  return;
}

Assistant:

void ARGBShadeRow_SSE2(const uint8_t* src_argb,
                       uint8_t* dst_argb,
                       int width,
                       uint32_t value) {
  asm volatile(
      "movd        %3,%%xmm2                     \n"
      "punpcklbw   %%xmm2,%%xmm2                 \n"
      "punpcklqdq  %%xmm2,%%xmm2                 \n"

      // 4 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "lea         0x10(%0),%0                   \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "punpcklbw   %%xmm0,%%xmm0                 \n"
      "punpckhbw   %%xmm1,%%xmm1                 \n"
      "pmulhuw     %%xmm2,%%xmm0                 \n"
      "pmulhuw     %%xmm2,%%xmm1                 \n"
      "psrlw       $0x8,%%xmm0                   \n"
      "psrlw       $0x8,%%xmm1                   \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb),  // %0
        "+r"(dst_argb),  // %1
        "+r"(width)      // %2
      : "r"(value)       // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2");
}